

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O2

bool EndsWith(string *s,string *suffix)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (s->_M_string_length < suffix->_M_string_length) {
    _Var1 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)s);
    _Var1 = std::operator==(&local_30,suffix);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return _Var1;
}

Assistant:

static bool EndsWith(const string& s, const string& suffix) {
  return (s.length() >= suffix.length() &&
          s.substr(s.length() - suffix.length()) == suffix);
}